

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_program.c
# Opt level: O0

int archive_write_add_filter_program(archive *_a,char *cmd)

{
  long *plVar1;
  int iVar2;
  archive_write_filter *paVar3;
  void *pvVar4;
  char *pcVar5;
  archive_write_program_data *paVar6;
  size_t n;
  archive_string *paVar7;
  char *in_RSI;
  archive *in_RDI;
  int magic_test;
  private_data_conflict5 *data;
  archive_write_filter *f;
  uint in_stack_00000050;
  uint in_stack_00000054;
  archive *in_stack_00000058;
  archive *in_stack_ffffffffffffffb0;
  archive_string *in_stack_ffffffffffffffb8;
  long *_p;
  undefined4 in_stack_ffffffffffffffd0;
  
  paVar3 = __archive_write_allocate_filter(in_stack_ffffffffffffffb0);
  iVar2 = __archive_check_magic(in_stack_00000058,in_stack_00000054,in_stack_00000050,(char *)_a);
  if (iVar2 != -0x1e) {
    pvVar4 = calloc(1,0x28);
    paVar3->data = pvVar4;
    if (paVar3->data != (void *)0x0) {
      plVar1 = (long *)paVar3->data;
      pcVar5 = strdup(in_RSI);
      plVar1[4] = (long)pcVar5;
      if (plVar1[4] != 0) {
        paVar6 = __archive_write_program_allocate();
        *plVar1 = (long)paVar6;
        if (*plVar1 != 0) {
          _p = plVar1 + 1;
          n = strlen(archive_write_add_filter_program::prefix);
          strlen(in_RSI);
          paVar7 = archive_string_ensure
                             (in_stack_ffffffffffffffb8,(size_t)in_stack_ffffffffffffffb0);
          if (paVar7 != (archive_string *)0x0) {
            plVar1[2] = 0;
            paVar7 = (archive_string *)(plVar1 + 1);
            if (archive_write_add_filter_program::prefix == (char *)0x0) {
              pvVar4 = (void *)0x0;
            }
            else {
              pvVar4 = (void *)strlen(archive_write_add_filter_program::prefix);
            }
            archive_strncat((archive_string *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),_p,n);
            archive_strcat(paVar7,pvVar4);
            paVar3->name = (char *)plVar1[1];
            paVar3->code = 4;
            paVar3->open = archive_compressor_program_open;
            paVar3->write = archive_compressor_program_write;
            paVar3->close = archive_compressor_program_close;
            paVar3->free = archive_compressor_program_free;
            return 0;
          }
        }
      }
    }
    archive_compressor_program_free((archive_write_filter *)in_stack_ffffffffffffffb0);
    archive_set_error(in_RDI,0xc,"Can\'t allocate memory for filter program");
  }
  return -0x1e;
}

Assistant:

int
archive_write_add_filter_program(struct archive *_a, const char *cmd)
{
	struct archive_write_filter *f = __archive_write_allocate_filter(_a);
	struct private_data *data;
	static const char *prefix = "Program: ";

	archive_check_magic(_a, ARCHIVE_WRITE_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_write_add_filter_program");

	f->data = calloc(1, sizeof(*data));
	if (f->data == NULL)
		goto memerr;
	data = (struct private_data *)f->data;

	data->cmd = strdup(cmd);
	if (data->cmd == NULL)
		goto memerr;

	data->pdata = __archive_write_program_allocate();
	if (data->pdata == NULL)
		goto memerr;

	/* Make up a description string. */
	if (archive_string_ensure(&data->description,
	    strlen(prefix) + strlen(cmd) + 1) == NULL)
		goto memerr;
	archive_strcpy(&data->description, prefix);
	archive_strcat(&data->description, cmd);

	f->name = data->description.s;
	f->code = ARCHIVE_FILTER_PROGRAM;
	f->open = archive_compressor_program_open;
	f->write = archive_compressor_program_write;
	f->close = archive_compressor_program_close;
	f->free = archive_compressor_program_free;
	return (ARCHIVE_OK);
memerr:
	archive_compressor_program_free(f);
	archive_set_error(_a, ENOMEM,
	    "Can't allocate memory for filter program");
	return (ARCHIVE_FATAL);
}